

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O1

int get_class_atom(REParseState *s,CharRange *cr,uint8_t **pp,BOOL inclass)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  char *fmt;
  BOOL is_ext;
  uint uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint8_t *p;
  char name [64];
  byte *local_c8;
  uint local_bc;
  byte local_b8 [64];
  byte local_78 [72];
  
  pbVar12 = *pp;
  uVar13 = (uint)*pbVar12;
  local_c8 = pbVar12;
  if (*pbVar12 == 0) {
    if (s->buf_end <= pbVar12) {
LAB_00174b62:
      fmt = "unexpected end";
      goto LAB_00174b69;
    }
    uVar13 = 0;
LAB_00174b50:
    if ((char)uVar13 < '\0') {
      uVar6 = unicode_from_utf8(local_c8,6,&local_c8);
      if ((0xffff < uVar6) && (s->is_utf16 == 0)) {
        fmt = "malformed unicode char";
LAB_00174b69:
        re_parse_error(s,fmt);
        goto LAB_00174b73;
      }
    }
    else {
      uVar6 = uVar13;
      local_c8 = local_c8 + 1;
    }
LAB_00175035:
    *pp = local_c8;
  }
  else {
    if (uVar13 != 0x5c) goto LAB_00174b50;
    pbVar9 = pbVar12 + 1;
    local_c8 = pbVar9;
    if (s->buf_end <= pbVar9) goto LAB_00174b62;
    local_c8 = pbVar12 + 2;
    bVar1 = pbVar12[1];
    uVar13 = (uint)bVar1;
    if (0x62 < bVar1) {
      if (bVar1 < 0x70) {
        if (uVar13 != 99) {
          local_bc = 0;
          if (uVar13 != 100) goto LAB_00174c33;
          goto LAB_00174ccc;
        }
        bVar1 = *local_c8;
        if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
          if (((inclass == 0) || (bVar1 != 0x5f && 9 < (byte)(bVar1 - 0x30))) || (s->is_utf16 != 0))
          {
            if (s->is_utf16 != 0) goto LAB_00174dba;
            uVar6 = 0x5c;
            local_c8 = pbVar9;
            goto LAB_00175035;
          }
        }
        uVar6 = bVar1 & 0x1f;
        local_c8 = pbVar12 + 3;
        goto LAB_00175035;
      }
      if (uVar13 != 0x70) {
        if (uVar13 == 0x73) {
          local_bc = 2;
        }
        else {
          if (uVar13 != 0x77) goto LAB_00174c33;
          local_bc = 4;
        }
        goto LAB_00174ccc;
      }
LAB_00174bc3:
      if (s->is_utf16 == 0) goto LAB_00174c33;
      if (*local_c8 == 0x7b) {
        bVar5 = pbVar12[3];
        pbVar12 = pbVar12 + 3;
        if (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
           (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b)) {
          uVar11 = 0;
          do {
            uVar10 = uVar11;
            if (0x3e < uVar10) goto LAB_00174f38;
            local_b8[uVar10] = bVar5;
            bVar5 = pbVar12[1];
            pbVar12 = pbVar12 + 1;
            uVar11 = uVar10 + 1;
          } while (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
                  (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b));
          pbVar9 = local_b8 + uVar10 + 1;
        }
        else {
          pbVar9 = local_b8;
        }
        *pbVar9 = 0;
        pbVar9 = local_78;
        if (*pbVar12 == 0x3d) {
          bVar5 = pbVar12[1];
          pbVar12 = pbVar12 + 1;
          if (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
             (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b)) {
            uVar11 = 0;
            do {
              uVar10 = uVar11;
              if (0x3e < uVar10) {
                fmt = "unknown unicode property value";
                goto LAB_00174b69;
              }
              local_78[uVar10] = bVar5;
              bVar5 = pbVar12[1];
              pbVar12 = pbVar12 + 1;
              uVar11 = uVar10 + 1;
            } while (((bVar5 == 0x5f) || (0xfffffff5 < bVar5 - 0x3a)) ||
                    (0xffffffe5 < (bVar5 & 0xffffffdf) - 0x5b));
            pbVar9 = local_78 + uVar10 + 1;
          }
        }
        *pbVar9 = 0;
        if (*pbVar12 == 0x7d) {
          is_ext = 0;
          if ((CONCAT13(local_b8[6],CONCAT12(local_b8[5],CONCAT11(local_b8[4],local_b8[3]))) ==
               0x747069 &&
               CONCAT13(local_b8[3],CONCAT12(local_b8[2],CONCAT11(local_b8[1],local_b8[0]))) ==
               0x69726353) ||
             (is_ext = 0, local_b8[2] == '\0' && CONCAT11(local_b8[1],local_b8[0]) == 0x6373)) {
LAB_00174f50:
            cr_init(cr,s->opaque,lre_realloc);
            iVar7 = unicode_script(cr,(char *)local_78,is_ext);
            if (iVar7 == 0) {
LAB_00175012:
              if ((bVar1 != 0x50) || (iVar7 = cr_invert(cr), iVar7 == 0)) {
                uVar6 = 0x40000000;
                local_c8 = pbVar12 + 1;
                goto LAB_00175035;
              }
              goto LAB_00174d5b;
            }
            cr_free(cr);
            if (iVar7 != -2) goto LAB_00175059;
            fmt = "unknown unicode script";
          }
          else {
            auVar15[0] = -(local_b8[0] == 'S');
            auVar15[1] = -(local_b8[1] == 'c');
            auVar15[2] = -(local_b8[2] == 'r');
            auVar15[3] = -(local_b8[3] == 'i');
            auVar15[4] = -(local_b8[4] == 'p');
            auVar15[5] = -(local_b8[5] == 't');
            auVar15[6] = -(local_b8[6] == '_');
            auVar15[7] = -(local_b8[7] == 'E');
            auVar15[8] = -(local_b8[8] == 'x');
            auVar15[9] = -(local_b8[9] == 't');
            auVar15[10] = -(local_b8[10] == 'e');
            auVar15[0xb] = -(local_b8[0xb] == 'n');
            auVar15[0xc] = -(local_b8[0xc] == 's');
            auVar15[0xd] = -(local_b8[0xd] == 'i');
            auVar15[0xe] = -(local_b8[0xe] == 'o');
            auVar15[0xf] = -(local_b8[0xf] == 'n');
            auVar16[0] = -((char)local_b8._16_2_ == 's');
            auVar16[1] = -(SUB21(local_b8._16_2_,1) == '\0');
            auVar16[2] = 0xff;
            auVar16[3] = 0xff;
            auVar16[4] = 0xff;
            auVar16[5] = 0xff;
            auVar16[6] = 0xff;
            auVar16[7] = 0xff;
            auVar16[8] = 0xff;
            auVar16[9] = 0xff;
            auVar16[10] = 0xff;
            auVar16[0xb] = 0xff;
            auVar16[0xc] = 0xff;
            auVar16[0xd] = 0xff;
            auVar16[0xe] = 0xff;
            auVar16[0xf] = 0xff;
            auVar16 = auVar16 & auVar15;
            is_ext = 1;
            if (((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) ||
               (CONCAT13(local_b8[3],CONCAT12(local_b8[2],CONCAT11(local_b8[1],local_b8[0]))) ==
                0x786373)) goto LAB_00174f50;
            if ((((char)local_b8._16_2_ == '\0' &&
                 CONCAT17(local_b8[7],
                          CONCAT16(local_b8[6],
                                   CONCAT15(local_b8[5],
                                            CONCAT14(local_b8[4],
                                                     CONCAT13(local_b8[3],
                                                              CONCAT12(local_b8[2],
                                                                       CONCAT11(local_b8[1],
                                                                                local_b8[0])))))))
                 == 0x5f6c6172656e6547) &&
                 CONCAT17(local_b8[0xf],
                          CONCAT16(local_b8[0xe],
                                   CONCAT15(local_b8[0xd],
                                            CONCAT14(local_b8[0xc],
                                                     CONCAT13(local_b8[0xb],
                                                              CONCAT12(local_b8[10],
                                                                       CONCAT11(local_b8[9],
                                                                                local_b8[8])))))))
                 == 0x79726f6765746143) ||
               (local_b8[2] == '\0' && CONCAT11(local_b8[1],local_b8[0]) == 0x6367)) {
              cr_init(cr,s->opaque,lre_realloc);
              iVar7 = unicode_general_category(cr,(char *)local_78);
              if (iVar7 != 0) {
                cr_free(cr);
                if (iVar7 == -2) {
                  fmt = "unknown unicode general category";
                  goto LAB_00174b69;
                }
                goto LAB_00175059;
              }
              goto LAB_00175012;
            }
            if (local_78[0] != 0) {
LAB_00174f38:
              fmt = "unknown unicode property name";
              goto LAB_00174b69;
            }
            cr_init(cr,s->opaque,lre_realloc);
            iVar7 = unicode_general_category(cr,(char *)local_b8);
            if (iVar7 == -1) {
              cr_free(cr);
            }
            else {
              if ((-1 < iVar7) || (iVar7 = unicode_prop(cr,(char *)local_b8), iVar7 == 0))
              goto LAB_00175012;
              cr_free(cr);
              if (iVar7 == -2) goto LAB_00174f38;
            }
LAB_00175059:
            fmt = "out of memory";
          }
        }
        else {
          fmt = "expecting \'}\'";
        }
      }
      else {
        fmt = "expecting \'{\' after \\p";
      }
      goto LAB_00174b69;
    }
    if (uVar13 == 0x52 || bVar1 < 0x52) {
      if (uVar13 != 0x44) {
        if (uVar13 == 0x50) goto LAB_00174bc3;
LAB_00174c33:
        iVar7 = s->is_utf16;
        local_c8 = pbVar9;
        uVar6 = lre_parse_escape(&local_c8,iVar7 * 2);
        if (-1 < (int)uVar6) goto LAB_00175035;
        if ((uVar6 == 0xfffffffe) && (*local_c8 != 0)) {
          pvVar8 = memchr("^$\\.*+?()[]{}|/",(uint)*local_c8,0x10);
          if ((iVar7 != 0) && (pvVar8 == (void *)0x0)) {
LAB_00174dba:
            fmt = "invalid escape sequence in regular expression";
            goto LAB_00174b69;
          }
        }
        else if (iVar7 != 0) goto LAB_00174dba;
        goto LAB_00174b50;
      }
      local_bc = 1;
    }
    else if (uVar13 == 0x53) {
      local_bc = 3;
    }
    else {
      if (uVar13 != 0x57) goto LAB_00174c33;
      local_bc = 5;
    }
LAB_00174ccc:
    puVar4 = *(ushort **)((long)char_range_table + (ulong)(local_bc & 0xfffffffe) * 4);
    uVar2 = *puVar4;
    cr_init(cr,s->opaque,lre_realloc);
    if (uVar2 != 0) {
      lVar14 = 0;
      do {
        uVar3 = *(ushort *)((long)puVar4 + lVar14 + 2);
        if ((cr->size <= cr->len) && (iVar7 = cr_realloc(cr,cr->len + 1), iVar7 != 0))
        goto LAB_00174d5b;
        iVar7 = cr->len;
        cr->len = iVar7 + 1;
        cr->points[iVar7] = (uint)uVar3;
        lVar14 = lVar14 + 2;
      } while ((ulong)uVar2 * 4 != lVar14);
    }
    uVar6 = 0x40000000;
    if (((local_bc & 1) == 0) || (iVar7 = cr_invert(cr), iVar7 == 0)) goto LAB_00175035;
LAB_00174d5b:
    cr_free(cr);
LAB_00174b73:
    uVar6 = 0xffffffff;
  }
  return uVar6;
}

Assistant:

static int get_class_atom(REParseState *s, CharRange *cr,
                          const uint8_t **pp, BOOL inclass)
{
    const uint8_t *p;
    uint32_t c;
    int ret;
    
    p = *pp;

    c = *p;
    switch(c) {
    case '\\':
        p++;
        if (p >= s->buf_end)
            goto unexpected_end;
        c = *p++;
        switch(c) {
        case 'd':
            c = CHAR_RANGE_d;
            goto class_range;
        case 'D':
            c = CHAR_RANGE_D;
            goto class_range;
        case 's':
            c = CHAR_RANGE_s;
            goto class_range;
        case 'S':
            c = CHAR_RANGE_S;
            goto class_range;
        case 'w':
            c = CHAR_RANGE_w;
            goto class_range;
        case 'W':
            c = CHAR_RANGE_W;
        class_range:
            if (cr_init_char_range(s, cr, c))
                return -1;
            c = CLASS_RANGE_BASE;
            break;
        case 'c':
            c = *p;
            if ((c >= 'a' && c <= 'z') ||
                (c >= 'A' && c <= 'Z') ||
                (((c >= '0' && c <= '9') || c == '_') &&
                 inclass && !s->is_utf16)) {   /* Annex B.1.4 */
                c &= 0x1f;
                p++;
            } else if (s->is_utf16) {
                goto invalid_escape;
            } else {
                /* otherwise return '\' and 'c' */
                p--;
                c = '\\';
            }
            break;
#ifdef CONFIG_ALL_UNICODE
        case 'p':
        case 'P':
            if (s->is_utf16) {
                if (parse_unicode_property(s, cr, &p, (c == 'P')))
                    return -1;
                c = CLASS_RANGE_BASE;
                break;
            }
            /* fall thru */
#endif
        default:
            p--;
            ret = lre_parse_escape(&p, s->is_utf16 * 2);
            if (ret >= 0) {
                c = ret;
            } else {
                if (ret == -2 && *p != '\0' && strchr("^$\\.*+?()[]{}|/", *p)) {
                    /* always valid to escape these characters */
                    goto normal_char;
                } else if (s->is_utf16) {
                invalid_escape:
                    return re_parse_error(s, "invalid escape sequence in regular expression");
                } else {
                    /* just ignore the '\' */
                    goto normal_char;
                }
            }
            break;
        }
        break;
    case '\0':
        if (p >= s->buf_end) {
        unexpected_end:
            return re_parse_error(s, "unexpected end");
        }
        /* fall thru */
    default:
    normal_char:
        /* normal char */
        if (c >= 128) {
            c = unicode_from_utf8(p, UTF8_CHAR_LEN_MAX, &p);
            if ((unsigned)c > 0xffff && !s->is_utf16) {
                /* XXX: should handle non BMP-1 code points */
                return re_parse_error(s, "malformed unicode char");
            }
        } else {
            p++;
        }
        break;
    }
    *pp = p;
    return c;
}